

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vfsUnlink(sqlite3_vfs *pVfs)

{
  bool bVar1;
  sqlite3_vfs *p;
  sqlite3_vfs *pVfs_local;
  
  if (pVfs != (sqlite3_vfs *)0x0) {
    if (vfsList == pVfs) {
      vfsList = pVfs->pNext;
    }
    else if (vfsList != (sqlite3_vfs *)0x0) {
      p = vfsList;
      while( true ) {
        bVar1 = false;
        if (p->pNext != (sqlite3_vfs *)0x0) {
          bVar1 = p->pNext != pVfs;
        }
        if (!bVar1) break;
        p = p->pNext;
      }
      if (p->pNext == pVfs) {
        p->pNext = pVfs->pNext;
      }
    }
  }
  return;
}

Assistant:

static void vfsUnlink(sqlite3_vfs *pVfs){
  assert( sqlite3_mutex_held(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN)) );
  if( pVfs==0 ){
    /* No-op */
  }else if( vfsList==pVfs ){
    vfsList = pVfs->pNext;
  }else if( vfsList ){
    sqlite3_vfs *p = vfsList;
    while( p->pNext && p->pNext!=pVfs ){
      p = p->pNext;
    }
    if( p->pNext==pVfs ){
      p->pNext = pVfs->pNext;
    }
  }
}